

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::OlsonTimeZone::getTimeZoneRules
          (OlsonTimeZone *this,InitialTimeZoneRule **initial,TimeZoneRule **trsrules,
          int32_t *trscount,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  SimpleTimeZone *pSVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int32_t tmpcnt;
  InitialTimeZoneRule *tmpini;
  int local_3c;
  undefined1 local_38 [8];
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  checkTransitionRules(this,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *initial = this->initialRule;
    iVar2 = *trscount;
    iVar5 = 0;
    if ((0 < iVar2 && this->historicRules != (TimeArrayTimeZoneRule **)0x0) &&
       (sVar1 = this->historicRuleCount, iVar5 = 0, 0 < (long)sVar1)) {
      lVar4 = 0;
      iVar5 = 0;
      do {
        if (this->historicRules[lVar4] != (TimeArrayTimeZoneRule *)0x0) {
          lVar6 = (long)iVar5;
          iVar5 = iVar5 + 1;
          trsrules[lVar6] = &this->historicRules[lVar4]->super_TimeZoneRule;
          if (iVar2 <= iVar5) break;
        }
        lVar4 = lVar4 + 1;
      } while (sVar1 != lVar4);
    }
    pSVar3 = this->finalZoneWithStartYear;
    local_3c = *trscount - iVar5;
    if ((local_3c != 0 && iVar5 <= *trscount) && pSVar3 != (SimpleTimeZone *)0x0) {
      (*(pSVar3->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x12])
                (pSVar3,local_38,trsrules + iVar5,&local_3c,status);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      iVar5 = iVar5 + local_3c;
    }
    *trscount = iVar5;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }